

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O0

void restore_track(memfile *mf)

{
  int8_t iVar1;
  int local_14;
  int i;
  memfile *mf_local;
  
  for (local_14 = 0; local_14 < 0x32; local_14 = local_14 + 1) {
    iVar1 = mread8(mf);
    utrack[local_14].x = iVar1;
    iVar1 = mread8(mf);
    utrack[local_14].y = iVar1;
  }
  utcnt = mread32(mf);
  utpnt = mread32(mf);
  return;
}

Assistant:

void restore_track(struct memfile *mf)
{
    int i;
    for (i = 0; i < UTSZ; i++) {
	utrack[i].x = mread8(mf);
	utrack[i].y = mread8(mf);
    }
    utcnt = mread32(mf);
    utpnt = mread32(mf);
}